

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<char> *a)

{
  bool bVar1;
  size_t sVar2;
  size_t count_00;
  int count;
  uint local_1c;
  
  if (a->m_a != (char *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity);
  }
  a->m_count = 0;
  local_1c = 0;
  bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_1c);
  if (0 < (int)local_1c && bVar1) {
    ON_SimpleArray<char>::SetCapacity(a,(ulong)local_1c);
    count_00 = (size_t)(int)local_1c;
    sVar2 = Read(this,count_00,a->m_a);
    bVar1 = sVar2 == count_00;
    if (bVar1) {
      bVar1 = true;
      if ((-1 < (int)local_1c) && ((int)local_1c <= a->m_capacity)) {
        a->m_count = local_1c;
      }
    }
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::ReadArray( ON_SimpleArray<char>& a )
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) {
    a.SetCapacity( count );
    rc = ReadChar( count, a.Array() );
    if ( rc )
      a.SetCount(count);
  }
  return rc;
}